

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O0

void cdef_filter_fb(CdefBlockInfo *fb_info,int plane,uint8_t use_highbitdepth)

{
  char in_DL;
  ptrdiff_t offset;
  int in_stack_00000098;
  int in_stack_0000009c;
  uint16_t *in_stack_000000a0;
  int in_stack_000000ac;
  uint16_t *in_stack_000000b0;
  uint8_t *in_stack_000000b8;
  int (*in_stack_000000e0) [16];
  int *in_stack_000000e8;
  int (*in_stack_000000f0) [16];
  int in_stack_000000f8;
  cdef_list *in_stack_00000100;
  int in_stack_00000108;
  int in_stack_00000110;
  int in_stack_00000118;
  int in_stack_00000120;
  int in_stack_00000128;
  
  if (in_DL == '\0') {
    av1_cdef_filter_fb(in_stack_000000b8,in_stack_000000b0,in_stack_000000ac,in_stack_000000a0,
                       in_stack_0000009c,in_stack_00000098,in_stack_000000e0,in_stack_000000e8,
                       in_stack_000000f0,in_stack_000000f8,in_stack_00000100,in_stack_00000108,
                       in_stack_00000110,in_stack_00000118,in_stack_00000120,in_stack_00000128);
  }
  else {
    av1_cdef_filter_fb(in_stack_000000b8,in_stack_000000b0,in_stack_000000ac,in_stack_000000a0,
                       in_stack_0000009c,in_stack_00000098,in_stack_000000e0,in_stack_000000e8,
                       in_stack_000000f0,in_stack_000000f8,in_stack_00000100,in_stack_00000108,
                       in_stack_00000110,in_stack_00000118,in_stack_00000120,in_stack_00000128);
  }
  return;
}

Assistant:

static inline void cdef_filter_fb(CdefBlockInfo *const fb_info, int plane,
                                  uint8_t use_highbitdepth) {
  ptrdiff_t offset =
      (ptrdiff_t)fb_info->dst_stride * fb_info->roffset + fb_info->coffset;
  if (use_highbitdepth) {
    av1_cdef_filter_fb(
        NULL, CONVERT_TO_SHORTPTR(fb_info->dst + offset), fb_info->dst_stride,
        &fb_info->src[CDEF_VBORDER * CDEF_BSTRIDE + CDEF_HBORDER],
        fb_info->xdec, fb_info->ydec, fb_info->dir, NULL, fb_info->var, plane,
        fb_info->dlist, fb_info->cdef_count, fb_info->level,
        fb_info->sec_strength, fb_info->damping, fb_info->coeff_shift);
  } else {
    av1_cdef_filter_fb(
        fb_info->dst + offset, NULL, fb_info->dst_stride,
        &fb_info->src[CDEF_VBORDER * CDEF_BSTRIDE + CDEF_HBORDER],
        fb_info->xdec, fb_info->ydec, fb_info->dir, NULL, fb_info->var, plane,
        fb_info->dlist, fb_info->cdef_count, fb_info->level,
        fb_info->sec_strength, fb_info->damping, fb_info->coeff_shift);
  }
}